

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transport2.c
# Opt level: O1

SeatPromptResult *
ssh2_transport_confirm_weak_crypto_primitive
          (SeatPromptResult *__return_storage_ptr__,ssh2_transport_state *s,char *type,char *name,
          void *alg)

{
  void *pvVar1;
  InteractionReadySeat IVar2;
  
  pvVar1 = find234(s->weak_algorithms_consented_to,alg,(cmpfn234)0x0);
  if (pvVar1 == (void *)0x0) {
    add234(s->weak_algorithms_consented_to,alg);
    IVar2 = interactor_announce((s->ppl).interactor);
    (*(IVar2.seat)->vt->confirm_weak_crypto_primitive)
              (__return_storage_ptr__,IVar2.seat,type,name,ssh2_transport_dialog_callback,s);
  }
  else {
    __return_storage_ptr__->kind = SPRK_OK;
    __return_storage_ptr__->errdata_lit = (char *)0x0;
  }
  return __return_storage_ptr__;
}

Assistant:

static SeatPromptResult ssh2_transport_confirm_weak_crypto_primitive(
    struct ssh2_transport_state *s, const char *type, const char *name,
    const void *alg)
{
    if (find234(s->weak_algorithms_consented_to, (void *)alg, NULL))
        return SPR_OK;
    add234(s->weak_algorithms_consented_to, (void *)alg);

    return seat_confirm_weak_crypto_primitive(
        ppl_get_iseat(&s->ppl), type, name, ssh2_transport_dialog_callback, s);
}